

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519.cc
# Opt level: O0

int pkey_ed25519_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  bool bVar1;
  uint8_t local_48 [8];
  uint8_t pubkey_unused [32];
  ED25519_KEY *key;
  EVP_PKEY *pkey_local;
  EVP_PKEY_CTX *ctx_local;
  
  pubkey_unused._24_8_ = OPENSSL_malloc(0x41);
  bVar1 = (void *)pubkey_unused._24_8_ != (void *)0x0;
  if (bVar1) {
    evp_pkey_set_method(pkey,&ed25519_asn1_meth);
    ED25519_keypair(local_48,(uint8_t *)pubkey_unused._24_8_);
    *(undefined1 *)(pubkey_unused._24_8_ + 0x40) = 1;
    OPENSSL_free(pkey->pkey);
    pkey->pkey = (void *)pubkey_unused._24_8_;
  }
  ctx_local._4_4_ = (uint)bVar1;
  return ctx_local._4_4_;
}

Assistant:

static int pkey_ed25519_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey) {
  ED25519_KEY *key =
      reinterpret_cast<ED25519_KEY *>(OPENSSL_malloc(sizeof(ED25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  evp_pkey_set_method(pkey, &ed25519_asn1_meth);

  uint8_t pubkey_unused[32];
  ED25519_keypair(pubkey_unused, key->key);
  key->has_private = 1;

  OPENSSL_free(pkey->pkey);
  pkey->pkey = key;
  return 1;
}